

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ehooks.h
# Opt level: O2

_Bool ehooks_purge_forced(tsdn_t *tsdn,ehooks_t *ehooks,void *addr,size_t size,size_t offset,
                         size_t length)

{
  extent_hooks_t *peVar1;
  _Bool _Var2;
  undefined1 uVar3;
  
  peVar1 = (extent_hooks_t *)(ehooks->ptr).repr;
  if (peVar1 == &duckdb_je_ehooks_default_extent_hooks) {
    _Var2 = duckdb_je_ehooks_default_purge_forced_impl(addr,offset,length);
    return _Var2;
  }
  if (peVar1->purge_forced == (undefined1 *)0x0) {
    uVar3 = 1;
  }
  else {
    ehooks_pre_reentrancy(tsdn);
    uVar3 = (*(code *)peVar1->purge_forced)(peVar1,addr,size,offset,length,ehooks->ind);
    ehooks_post_reentrancy(tsdn);
  }
  return (_Bool)uVar3;
}

Assistant:

static inline bool
ehooks_purge_forced(tsdn_t *tsdn, ehooks_t *ehooks, void *addr, size_t size,
    size_t offset, size_t length) {
	extent_hooks_t *extent_hooks = ehooks_get_extent_hooks_ptr(ehooks);
	/*
	 * It would be correct to have a ehooks_debug_zero_check call at the end
	 * of this function; purge_forced is required to zero.  But checking
	 * would touch the page in question, which may have performance
	 * consequences (imagine the hooks are using hugepages, with a global
	 * zero page off).  Even in debug mode, it's usually a good idea to
	 * avoid cases that can dramatically increase memory consumption.
	 */
#ifdef PAGES_CAN_PURGE_FORCED
	if (extent_hooks == &ehooks_default_extent_hooks) {
		return ehooks_default_purge_forced_impl(addr, offset, length);
	}
#endif
	if (extent_hooks->purge_forced == NULL) {
		return true;
	} else {
		ehooks_pre_reentrancy(tsdn);
		bool err = extent_hooks->purge_forced(extent_hooks, addr, size,
		    offset, length, ehooks_ind_get(ehooks));
		ehooks_post_reentrancy(tsdn);
		return err;
	}
}